

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O0

void __thiscall
dlib::
array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
::set_size(array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
           *this,unsigned_long size)

{
  unsigned_long uVar1;
  ostream *poVar2;
  ostream *poVar3;
  string *a;
  undefined8 uVar4;
  ulong in_RSI;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_RDI;
  ostringstream dlib_o_out;
  error_type t;
  ostream local_188;
  ulong local_10;
  
  local_10 = in_RSI;
  uVar1 = max_size(in_RDI);
  if (uVar1 < in_RSI) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
    poVar2 = std::operator<<(&local_188,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x184);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(&local_188,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/threads/../array/array_kernel.h"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(&local_188,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::array<dlib::thread_pool_implementation::task_state_type>::set_size(unsigned long) [T = dlib::thread_pool_implementation::task_state_type, mem_manager = dlib::memory_manager_stateless_kernel_1<char>]"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<(&local_188,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"( size <= this->max_size() )");
    std::operator<<(poVar2,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(&local_188,std::boolalpha);
    poVar2 = std::operator<<(poVar2,"\tvoid array::set_size");
    poVar2 = std::operator<<(poVar2,"\n\tsize must be <= max_size()");
    poVar2 = std::operator<<(poVar2,"\n\tsize: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
    poVar3 = std::operator<<(poVar2,"\n\tmax size: ");
    uVar1 = max_size(in_RDI);
    a = (string *)std::ostream::operator<<(poVar3,uVar1);
    t = (error_type)((ulong)poVar3 >> 0x20);
    poVar3 = std::operator<<((ostream *)a,"\n\tthis: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI);
    std::operator<<(poVar3,"\n");
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar2,t,a);
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  (*(in_RDI->super_enumerable<dlib::thread_pool_implementation::task_state_type>)._vptr_enumerable
    [3])();
  in_RDI->array_size = local_10;
  if (local_10 == 0) {
    in_RDI->last_pos = (task_state_type *)0x0;
  }
  else {
    in_RDI->last_pos = in_RDI->array_elements + (local_10 - 1);
  }
  return;
}

Assistant:

void array<T,mem_manager>::
    set_size (
        unsigned long size
    )
    {
        // make sure requires clause is not broken
        DLIB_CASSERT(( size <= this->max_size() ),
            "\tvoid array::set_size"
            << "\n\tsize must be <= max_size()"
            << "\n\tsize: " << size 
            << "\n\tmax size: " << this->max_size()
            << "\n\tthis: " << this
            );

        reset();
        array_size = size;
        if (size > 0)
            last_pos = array_elements + size - 1;
        else
            last_pos = 0;
    }